

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_int_base.cpp
# Opt level: O2

string * __thiscall
sc_dt::sc_int_base::to_string_abi_cxx11_
          (string *__return_storage_ptr__,sc_int_base *this,sc_numrep numrep,bool w_prefix)

{
  sc_fxcast_switch local_54;
  sc_fix aa;
  
  local_54.m_sw = SC_ON;
  sc_fix::sc_fix((sc_fix *)&aa.super_sc_fxnum,this,this->m_len,this->m_len,SC_TRN,SC_WRAP,0,
                 &local_54,(sc_fxnum_observer *)0x0);
  sc_fxnum::to_string_abi_cxx11_(__return_storage_ptr__,&aa.super_sc_fxnum,numrep,w_prefix);
  sc_fxnum::~sc_fxnum(&aa.super_sc_fxnum);
  return __return_storage_ptr__;
}

Assistant:

const std::string
sc_int_base::to_string( sc_numrep numrep, bool w_prefix ) const
{
    int len = m_len;
    sc_fix aa( *this, len, len, SC_TRN, SC_WRAP, 0, SC_ON );
    return aa.to_string( numrep, w_prefix );
}